

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O3

void __thiscall
cert::Camera::Camera(Camera *this,Vec3 lookfrom,Vec3 lookat,Vec3 vup,float vfov,float aspect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar15;
  undefined1 auVar14 [16];
  float fVar16;
  float fVar17;
  float in_XMM4_Dc;
  float in_XMM4_Dd;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float local_78;
  float fStack_74;
  float local_48;
  
  dVar4 = ((double)vfov * 3.141) / 180.0;
  fVar7 = (float)dVar4 * 0.5;
  *(undefined8 *)&(this->horizontal).z = 0;
  (this->vertical).y = 0.0;
  (this->vertical).z = 0.0;
  (this->upper_left_corner).y = 0.0;
  (this->upper_left_corner).z = 0.0;
  (this->horizontal).x = 0.0;
  (this->horizontal).y = 0.0;
  (this->origin).x = 0.0;
  (this->origin).y = 0.0;
  *(undefined8 *)&(this->origin).z = 0;
  dVar4 = sin((double)CONCAT44((int)((ulong)dVar4 >> 0x20),fVar7));
  dVar5 = cos((double)(ulong)(uint)fVar7);
  local_48 = SUB84(dVar4,0);
  local_48 = local_48 / SUB84(dVar5,0);
  fVar8 = aspect * local_48;
  local_98._0_4_ = lookfrom.x;
  local_98._4_4_ = lookfrom.y;
  (this->origin).x = (float)local_98._0_4_;
  (this->origin).y = (float)local_98._4_4_;
  (this->origin).z = lookfrom.z;
  local_78 = lookat.x;
  fStack_74 = lookat.y;
  fStack_74 = (float)local_98._4_4_ - fStack_74;
  fStack_84 = vup.y;
  fVar7 = lookfrom.z - lookat.z;
  local_98._4_4_ = (float)local_98._0_4_ - local_78;
  fStack_90 = (float)local_98._0_4_ - local_78;
  fStack_8c = (float)local_98._0_4_ - local_78;
  local_98._0_4_ = fVar7;
  dVar4 = sqrt((double)CONCAT44(local_98._4_4_,
                                fVar7 * fVar7 +
                                (float)local_98._4_4_ * (float)local_98._4_4_ +
                                fStack_74 * fStack_74));
  fVar7 = SUB84(dVar4,0);
  fStack_74 = fStack_74 / fVar7;
  auVar14._4_4_ = fVar7;
  auVar14._0_4_ = fVar7;
  auVar14._8_4_ = fVar7;
  auVar14._12_4_ = fVar7;
  auVar14 = divps(_local_98,auVar14);
  local_88 = vup.x;
  fVar13 = auVar14._0_4_;
  fVar15 = auVar14._4_4_;
  fVar10 = fStack_84 * fVar13 - vup.z * fStack_74;
  fVar11 = vup.z * fVar15 - local_88 * fVar13;
  fVar9 = local_88 * fStack_74 - fStack_84 * fVar15;
  dVar4 = sqrt((double)CONCAT44(fStack_84,fVar9 * fVar9 + fVar10 * fVar10 + fVar11 * fVar11));
  fVar7 = SUB84(dVar4,0);
  fVar9 = fVar9 / fVar7;
  auVar6._4_4_ = fVar11;
  auVar6._0_4_ = fVar10;
  auVar6._8_4_ = in_XMM4_Dc * auVar14._8_4_ - in_XMM4_Dc * fVar13;
  auVar6._12_4_ = in_XMM4_Dd * auVar14._12_4_ - in_XMM4_Dd * fVar13;
  auVar3._4_4_ = fVar7;
  auVar3._0_4_ = fVar7;
  auVar3._8_4_ = fVar7;
  auVar3._12_4_ = fVar7;
  auVar14 = divps(auVar6,auVar3);
  fVar16 = auVar14._0_4_;
  fVar17 = auVar14._4_4_;
  fVar11 = fVar9 * fStack_74 - fVar17 * fVar13;
  fVar12 = fVar16 * fVar13 - fVar9 * fVar15;
  fVar10 = fVar17 * fVar15 - fVar16 * fStack_74;
  uVar1 = (this->origin).x;
  uVar2 = (this->origin).y;
  fVar7 = (this->origin).z;
  (this->upper_left_corner).x = (local_48 * fVar11 + ((float)uVar1 - fVar8 * fVar16)) - fVar15;
  (this->upper_left_corner).y = (local_48 * fVar12 + ((float)uVar2 - fVar8 * fVar17)) - fStack_74;
  (this->upper_left_corner).z = (local_48 * fVar10 + (fVar7 - fVar8 * fVar9)) - fVar13;
  fVar8 = fVar8 + fVar8;
  (this->horizontal).x = fVar8 * fVar16;
  (this->horizontal).y = fVar8 * fVar17;
  (this->horizontal).z = fVar8 * fVar9;
  local_48 = local_48 + local_48;
  (this->vertical).x = local_48 * fVar11;
  (this->vertical).y = local_48 * fVar12;
  (this->vertical).z = local_48 * fVar10;
  return;
}

Assistant:

constexpr Camera (Vec3 lookfrom, Vec3 lookat, Vec3 vup, float vfov, float aspect)
	{
		Vec3 u, v, w;
		float theta = vfov * 3.141 / 180;
		float half_height = tan (theta / 2);
		float half_width = aspect * half_height;
		origin = lookfrom;
		w = normalize (lookfrom - lookat);
		u = normalize (cross (vup, w));
		v = cross (w, u);
		upper_left_corner = origin - half_width * u + half_height * v - w;
		horizontal = 2 * half_width * u;
		vertical = 2 * half_height * v;
	}